

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> * __thiscall
testing::internal::
ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
::GetOrCreateValue(ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
                   *this)

{
  int iVar1;
  ValueHolder *this_00;
  ValueHolderFactory *pVVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  GTestLog local_38;
  int local_34;
  ThreadLocalValueHolderBase *pTStack_30;
  int gtest_error;
  ThreadLocalValueHolderBase *holder_base;
  ValueHolder *new_holder;
  ThreadLocalValueHolderBase *holder;
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  *this_local;
  
  holder = (ThreadLocalValueHolderBase *)this;
  new_holder = (ValueHolder *)pthread_getspecific(this->key_);
  if (new_holder == (ValueHolder *)0x0) {
    pVVar2 = scoped_ptr<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory>
             ::operator->(&this->default_factory_);
    iVar1 = (*pVVar2->_vptr_ValueHolderFactory[2])();
    pTStack_30 = (ThreadLocalValueHolderBase *)CONCAT44(extraout_var,iVar1);
    holder_base = pTStack_30;
    local_34 = pthread_setspecific(this->key_,pTStack_30);
    if (local_34 != 0) {
      GTestLog::GTestLog(&local_38,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/build_O0/test/googletest/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                         ,0x824);
      poVar3 = GTestLog::GetStream(&local_38);
      poVar3 = std::operator<<(poVar3,"pthread_setspecific(key_, holder_base)");
      poVar3 = std::operator<<(poVar3,"failed with error ");
      std::ostream::operator<<(poVar3,local_34);
      GTestLog::~GTestLog(&local_38);
    }
    this_local = (ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
                  *)ValueHolder::pointer((ValueHolder *)holder_base);
  }
  else {
    this_00 = CheckedDowncastToActualType<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
                        ((ThreadLocalValueHolderBase *)new_holder);
    this_local = (ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
                  *)ValueHolder::pointer(this_00);
  }
  return (vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *)
         this_local;
}

Assistant:

T* GetOrCreateValue() const {
    ThreadLocalValueHolderBase* const holder =
        static_cast<ThreadLocalValueHolderBase*>(pthread_getspecific(key_));
    if (holder != NULL) {
      return CheckedDowncastToActualType<ValueHolder>(holder)->pointer();
    }

    ValueHolder* const new_holder = default_factory_->MakeNewHolder();
    ThreadLocalValueHolderBase* const holder_base = new_holder;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_setspecific(key_, holder_base));
    return new_holder->pointer();
  }